

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,OrderCancelRequest *message,SessionID *param_2)

{
  Side side_00;
  Side side;
  Symbol symbol;
  OrigClOrdID origClOrdID;
  FieldBase FStack_118;
  FieldBase local_c0;
  FieldBase local_68;
  
  FIX::OrigClOrdID::OrigClOrdID((OrigClOrdID *)&local_68);
  FIX::Symbol::Symbol((Symbol *)&local_c0);
  FIX::Side::Side((Side *)&FStack_118);
  FIX::FieldMap::getField((FieldMap *)message,&local_68);
  FIX::FieldMap::getField((FieldMap *)message,&local_c0);
  FIX::FieldMap::getField((FieldMap *)message,&FStack_118);
  side_00 = convert((Application *)message,(Side *)&FStack_118);
  processCancel(this,&local_68.m_string,&local_c0.m_string,side_00);
  FIX::FieldBase::~FieldBase(&FStack_118);
  FIX::FieldBase::~FieldBase(&local_c0);
  FIX::FieldBase::~FieldBase(&local_68);
  return;
}

Assistant:

void Application::onMessage(const FIX42::OrderCancelRequest &message, const FIX::SessionID &) {
  FIX::OrigClOrdID origClOrdID;
  FIX::Symbol symbol;
  FIX::Side side;

  message.get(origClOrdID);
  message.get(symbol);
  message.get(side);

  try {
    processCancel(origClOrdID, symbol, convert(side));
  } catch (std::exception &) {}
}